

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O3

void __thiscall UDPServer::respond<dto::Simple>(UDPServer *this,Poll *p,Simple *dto)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ostream *poVar6;
  string resp_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sockaddr_in>
  local_58;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"UDPServer: responding ",0x16);
  poVar6 = operator<<((ostream *)&std::cout,dto);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  uVar2 = (dto->header).cmd_seq;
  sVar3 = (dto->payload)._M_string_length;
  (dto->header).cmd_seq =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)sVar3 + '\x12');
  paVar1 = local_78;
  *(undefined2 *)(local_78->_M_local_buf + 0x10) = *(undefined2 *)((long)&(dto->header).cmd_seq + 6)
  ;
  uVar4 = *(undefined8 *)((dto->header).cmd + 8);
  paVar1->_M_allocated_capacity = *(size_type *)(dto->header).cmd;
  *(undefined8 *)(paVar1->_M_local_buf + 8) = uVar4;
  paVar5 = local_78;
  memcpy(local_78->_M_local_buf + 0x12,(dto->payload)._M_dataplus._M_p,
         (dto->payload)._M_string_length);
  uVar2 = (dto->header).cmd_seq;
  (dto->header).cmd_seq =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  paVar1 = &local_58.first.field_2;
  if (paVar5 == &local_68) {
    local_58.first.field_2._8_8_ = local_68._8_8_;
    local_58.first._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_58.first._M_dataplus._M_p = (pointer)paVar5;
  }
  local_58.first.field_2._M_allocated_capacity._1_7_ = local_68._M_allocated_capacity._1_7_;
  local_58.first.field_2._M_local_buf[0] = local_68._M_local_buf[0];
  local_58.first._M_string_length = local_70;
  local_70 = 0;
  local_68._M_local_buf[0] = '\0';
  local_58.second.sin_family = (this->current_client).sin_family;
  local_58.second.sin_port = (this->current_client).sin_port;
  local_58.second.sin_addr.s_addr = (this->current_client).sin_addr.s_addr;
  local_58.second.sin_zero = *&(this->current_client).sin_zero;
  local_78 = &local_68;
  std::
  deque<std::pair<std::__cxx11::string,sockaddr_in>,std::allocator<std::pair<std::__cxx11::string,sockaddr_in>>>
  ::emplace_back<std::pair<std::__cxx11::string,sockaddr_in>>
            ((deque<std::pair<std::__cxx11::string,sockaddr_in>,std::allocator<std::pair<std::__cxx11::string,sockaddr_in>>>
              *)&this->msg_queue,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first._M_dataplus._M_p,local_58.first.field_2._M_allocated_capacity + 1
                   );
  }
  Subscriber::set_expected(&this->super_Subscriber,5);
  Poll::notify_subscriber_changed(p,&this->super_Subscriber);
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void UDPServer::respond(Poll &p, T dto) {
  std::cout << "UDPServer: responding " << dto << std::endl;
  auto resp_str = dto::marshall(dto);
  msg_queue.emplace(std::make_pair(std::move(resp_str), current_client));
  set_expected(POLLIN | POLLOUT);
  p.notify_subscriber_changed(*this);
}